

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_slay(parser *p)

{
  int iVar1;
  long *plVar2;
  char *__s1;
  uint local_2c;
  wchar_t idx;
  char *name;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  plVar2 = (long *)parser_priv(p);
  __s1 = parser_getsym(p,"name");
  local_2c = (uint)z_info->slay_max;
  if (plVar2 != (long *)0x0) {
    if (*plVar2 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      if (__s1 != (char *)0x0) {
        local_2c = 1;
        while (((int)local_2c < (int)(uint)z_info->slay_max &&
               (iVar1 = strcmp(__s1,slays[(int)local_2c].code), iVar1 != 0))) {
          local_2c = local_2c + 1;
        }
      }
      if (local_2c == z_info->slay_max) {
        p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SLAY;
      }
      else {
        *(uint *)(*plVar2 + 0x70) = local_2c;
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
    }
    return p_local._4_4_;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                ,0x187,"enum parser_error parse_player_timed_slay(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_slay(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getsym(p, "name");
	int idx = z_info->slay_max;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (name) {
		for (idx = 1; idx < z_info->slay_max; ++idx) {
			if (streq(name, slays[idx].code)) break;
		}
	}
	if (idx == z_info->slay_max) {
		return PARSE_ERROR_UNRECOGNISED_SLAY;
	}
	ps->t->temp_slay = idx;
	return PARSE_ERROR_NONE;
}